

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

void __thiscall CoreML::ShapeRange::setValue(ShapeRange *this,RangeValue *val)

{
  bool bVar1;
  size_t sVar2;
  runtime_error *prVar3;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (val->_isUnbound == true) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Can\'t set shape range to have value \'unbound\'.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = isValid(this,val);
  if (bVar1) {
    bVar1 = val->_isUnbound != false;
    if (!bVar1) {
      sVar2 = RangeValue::value(val);
      (this->_minimum)._val = sVar2;
    }
    (this->_minimum)._isUnbound = bVar1;
    bVar1 = val->_isUnbound != false;
    if (!bVar1) {
      sVar2 = RangeValue::value(val);
      (this->_maximum)._val = sVar2;
    }
    (this->_maximum)._isUnbound = bVar1;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Invalid setValue ",0x11);
  ::operator<<(local_198,val);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," for range: ",0xc);
  ::operator<<(local_198,this);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"\n",1);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,asStack_1c8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ShapeRange::setValue(const RangeValue& val) {
    if (val.isUnbound())
        throw std::runtime_error("Can't set shape range to have value 'unbound'.");

    if (isValid(val)) {
        _minimum.set(val);
        _maximum.set(val);
    }
    else {
        std::stringstream ss;
        ss << "Invalid setValue " << val << " for range: " << *this << "\n";
        throw std::runtime_error(ss.str());
    }
}